

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderFragDataTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderFragDataTests::init(ShaderFragDataTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  pointer ppTVar3;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> negativeCases;
  ShaderLibrary library;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_50;
  ShaderLibrary local_38;
  
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"valid_static_index",
             "Valid gl_FragData[] assignment using static index");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00793b58;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"valid_uniform_index",
             "Valid gl_FragData[] assignment using uniform index");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00793b58;
  *(undefined4 *)&pTVar2[1].m_testCtx = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"valid_dynamic_index",
             "Valid gl_FragData[] assignment using dynamic index");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00793b58;
  *(undefined4 *)&pTVar2[1].m_testCtx = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_38,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  deqp::gls::ShaderLibrary::loadShaderFile(&local_50,&local_38,"shaders/fragdata.test");
  for (ppTVar3 = local_50.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      local_50.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    tcu::TestNode::addChild((TestNode *)this,*ppTVar3);
  }
  if (local_50.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_38);
  return extraout_EAX;
}

Assistant:

void ShaderFragDataTests::init (void)
{
	addChild(new FragDataIndexingCase(m_context, "valid_static_index",	"Valid gl_FragData[] assignment using static index",	INDEX_EXPR_STATIC));
	addChild(new FragDataIndexingCase(m_context, "valid_uniform_index",	"Valid gl_FragData[] assignment using uniform index",	INDEX_EXPR_UNIFORM));
	addChild(new FragDataIndexingCase(m_context, "valid_dynamic_index",	"Valid gl_FragData[] assignment using dynamic index",	INDEX_EXPR_DYNAMIC));

	// Negative cases.
	{
		gls::ShaderLibrary library(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::vector<tcu::TestNode*> negativeCases = library.loadShaderFile("shaders/fragdata.test");

		for (std::vector<tcu::TestNode*>::iterator i = negativeCases.begin(); i != negativeCases.end(); i++)
			addChild(*i);
	}
}